

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O1

void rereadFile(MultiPartInputFile *in,vector<partData,_std::allocator<partData>_> *parts,
               fileMetrics *metrics)

{
  pointer ppVar1;
  size_t __n;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  DeepTiledInputPart inpart;
  string type;
  DeepTiledInputPart local_58 [8];
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if ((parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar5 = 0x48;
    lVar4 = 0x1e8;
    uVar7 = 0;
    do {
      Imf_3_4::MultiPartInputFile::header((int)in);
      plVar3 = (long *)Imf_3_4::Header::type_abi_cxx11_();
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar3,plVar3[1] + *plVar3);
      __n = local_48;
      iVar6 = (int)uVar7;
      if (local_48 == DAT_00116500) {
        if (local_48 != 0) {
          iVar2 = bcmp(local_50,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,local_48);
          if (iVar2 != 0) goto LAB_0010cb7f;
        }
        Imf_3_4::InputPart::InputPart((InputPart *)local_58,in,iVar6);
        readScanLine((InputPart *)local_58,
                     (FrameBuffer *)
                     ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl
                            .super__Vector_impl_data._M_start + lVar4 + -0x48),
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(((metrics->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_start)->readPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar5));
      }
      else {
LAB_0010cb7f:
        if (__n == DAT_00116520) {
          if (__n != 0) {
            iVar2 = bcmp(local_50,Imf_3_4::TILEDIMAGE_abi_cxx11_,__n);
            if (iVar2 != 0) goto LAB_0010cbad;
          }
          Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)local_58,in,iVar6);
          readTiled((TiledInputPart *)local_58,
                    (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                    ((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar4 + -0x18),
                    (vector<double,_std::allocator<double>_> *)
                    ((long)&(((metrics->stats).
                              super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                              super__Vector_impl_data._M_start)->readPerf).
                            super__Vector_base<double,_std::allocator<double>_> + lVar5));
        }
        else {
LAB_0010cbad:
          if (__n == DAT_00116540) {
            if (__n != 0) {
              iVar2 = bcmp(local_50,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n);
              if (iVar2 != 0) goto LAB_0010cbdb;
            }
            Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                      ((DeepScanLineInputPart *)local_58,in,iVar6);
            ppVar1 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            readDeepScanLine((DeepScanLineInputPart *)local_58,
                             (DeepFrameBuffer *)
                             ((long)&(((parts->
                                       super__Vector_base<partData,_std::allocator<partData>_>).
                                       _M_impl.super__Vector_impl_data._M_start)->readBuf).
                                     scanlinePixelData.
                                     super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                             + lVar4),(vector<double,_std::allocator<double>_> *)
                                      ((long)&(ppVar1->readPerf).
                                              super__Vector_base<double,_std::allocator<double>_> +
                                      lVar5),
                             (vector<double,_std::allocator<double>_> *)
                             ((long)&(ppVar1->countReadPerf).
                                     super__Vector_base<double,_std::allocator<double>_> + lVar5));
          }
          else {
LAB_0010cbdb:
            if (__n == DAT_00116560) {
              if (__n != 0) {
                iVar2 = bcmp(local_50,Imf_3_4::DEEPTILE_abi_cxx11_,__n);
                if (iVar2 != 0) goto LAB_0010ccea;
              }
              Imf_3_4::DeepTiledInputPart::DeepTiledInputPart(local_58,in,iVar6);
              ppVar1 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              readDeepTiled(local_58,(DeepFrameBuffer *)
                                     ((long)&(((parts->
                                               super__Vector_base<partData,_std::allocator<partData>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->readBuf)
                                             .scanlinePixelData.
                                             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                                     + lVar4),
                            (vector<double,_std::allocator<double>_> *)
                            ((long)&(ppVar1->readPerf).
                                    super__Vector_base<double,_std::allocator<double>_> + lVar5),
                            (vector<double,_std::allocator<double>_> *)
                            ((long)&(ppVar1->countReadPerf).
                                    super__Vector_base<double,_std::allocator<double>_> + lVar5));
            }
          }
        }
      }
LAB_0010ccea:
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0xc0;
      lVar4 = lVar4 + 0x250;
    } while (uVar7 < (ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>)
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x14c1bacf914c1bad));
  }
  return;
}

Assistant:

void
rereadFile (
    MultiPartInputFile& in, vector<partData>& parts, fileMetrics& metrics)
{
    //
    // Call initialization functions, Read image from source.
    //
    for (size_t p = 0; p < parts.size (); ++p)
    {
        string type = in.header (p).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, p);
            readScanLine (
                inpart,
                parts[p].rereadBuf.scanlineBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, p);
            readTiled (
                inpart,
                parts[p].rereadBuf.tiledBuf,
                metrics.stats[p].rereadPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, p);
            readDeepScanLine (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, p);
            readDeepTiled (
                inpart,
                parts[p].rereadBuf.deepbuf,
                metrics.stats[p].rereadPerf,
                metrics.stats[p].countRereadPerf);
        }
    }
}